

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O1

void __thiscall
ImPlot::
ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<unsigned_short>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLog>
               *this,GetterYs<unsigned_short> *getter1,GetterYRef *getter2,
              TransformerLogLog *transformer,ImU32 col)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  ushort uVar5;
  int iVar6;
  ImPlotPlot *pIVar7;
  GetterYRef *pGVar8;
  TransformerLogLog *pTVar9;
  double dVar10;
  double dVar11;
  ImPlotContext *pIVar12;
  int iVar13;
  ImVec2 IVar14;
  ImVec2 IVar15;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar6 = getter1->Count;
  iVar13 = getter2->Count;
  if (iVar6 < getter2->Count) {
    iVar13 = iVar6;
  }
  this->Prims = iVar13 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar12 = GImPlot;
  (this->P12).y = 0.0;
  uVar5 = *(ushort *)
           ((long)getter1->Ys +
           (long)((getter1->Offset % iVar6 + iVar6) % iVar6) * (long)getter1->Stride);
  dVar10 = log10((getter1->XScale * 0.0 + getter1->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar1 = pIVar12->LogDenX;
  pIVar7 = pIVar12->CurrentPlot;
  dVar2 = (pIVar7->XAxis).Range.Min;
  dVar3 = (pIVar7->XAxis).Range.Max;
  dVar11 = log10((double)uVar5 / pIVar7->YAxis[transformer->YAxis].Range.Min);
  iVar6 = transformer->YAxis;
  pIVar7 = pIVar12->CurrentPlot;
  dVar4 = pIVar7->YAxis[iVar6].Range.Min;
  IVar14.x = (float)((((double)(float)(dVar10 / dVar1) * (dVar3 - dVar2) + dVar2) -
                     (pIVar7->XAxis).Range.Min) * pIVar12->Mx +
                    (double)pIVar12->PixelRange[iVar6].Min.x);
  IVar14.y = (float)((((double)(float)(dVar11 / pIVar12->LogDenY[iVar6]) *
                       (pIVar7->YAxis[iVar6].Range.Max - dVar4) + dVar4) - dVar4) *
                     pIVar12->My[iVar6] + (double)pIVar12->PixelRange[iVar6].Min.y);
  this->P11 = IVar14;
  pIVar12 = GImPlot;
  pGVar8 = this->Getter2;
  pTVar9 = this->Transformer;
  dVar1 = pGVar8->YRef;
  dVar10 = log10((pGVar8->XScale * 0.0 + pGVar8->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  dVar2 = pIVar12->LogDenX;
  pIVar7 = pIVar12->CurrentPlot;
  dVar3 = (pIVar7->XAxis).Range.Min;
  dVar4 = (pIVar7->XAxis).Range.Max;
  dVar11 = log10(dVar1 / pIVar7->YAxis[pTVar9->YAxis].Range.Min);
  iVar6 = pTVar9->YAxis;
  pIVar7 = pIVar12->CurrentPlot;
  dVar1 = pIVar7->YAxis[iVar6].Range.Min;
  IVar15.x = (float)((((double)(float)(dVar10 / dVar2) * (dVar4 - dVar3) + dVar3) -
                     (pIVar7->XAxis).Range.Min) * pIVar12->Mx +
                    (double)pIVar12->PixelRange[iVar6].Min.x);
  IVar15.y = (float)((((double)(float)(dVar11 / pIVar12->LogDenY[iVar6]) *
                       (pIVar7->YAxis[iVar6].Range.Max - dVar1) + dVar1) - dVar1) *
                     pIVar12->My[iVar6] + (double)pIVar12->PixelRange[iVar6].Min.y);
  this->P12 = IVar15;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }